

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::testGroupEnded
          (CumulativeReporterBase<Catch::SonarQubeReporter> *this,TestGroupStats *testGroupStats)

{
  shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>
  node;
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>
  *__x;
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>
  *in_stack_ffffffffffffffd0;
  TestGroupStats *in_stack_ffffffffffffffe8;
  
  __x = (vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>
         *)&stack0xffffffffffffffe0;
  std::
  make_shared<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>>,Catch::TestGroupStats_const&>
            (in_stack_ffffffffffffffe8);
  clara::std::
  __shared_ptr_access<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x185626);
  clara::std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>
  ::swap(in_stack_ffffffffffffffd0,__x);
  clara::std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>_>
  ::push_back((vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>_>
               *)in_stack_ffffffffffffffd0,(value_type *)__x);
  clara::std::
  shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>
  ::~shared_ptr((shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>
                 *)0x18565a);
  return;
}

Assistant:

void testGroupEnded(TestGroupStats const& testGroupStats) override {
            auto node = std::make_shared<TestGroupNode>(testGroupStats);
            node->children.swap(m_testCases);
            m_testGroups.push_back(node);
        }